

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

PREDICTION_MODE read_intra_mode(aom_reader *r,aom_cdf_prob *cdf)

{
  int iVar1;
  
  iVar1 = aom_read_symbol_(r,cdf,0xd);
  return (PREDICTION_MODE)iVar1;
}

Assistant:

static PREDICTION_MODE read_intra_mode(aom_reader *r, aom_cdf_prob *cdf) {
  return (PREDICTION_MODE)aom_read_symbol(r, cdf, INTRA_MODES, ACCT_STR);
}